

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# location_fwd.hpp
# Opt level: O0

void __thiscall toml::detail::location::location(location *this,location *param_2)

{
  long in_RSI;
  shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_ffffffffffffffc8;
  
  CLI::std::shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
  shared_ptr(in_RDI,in_stack_ffffffffffffffc8);
  std::__cxx11::string::string(in_stack_00000010,in_stack_00000008);
  in_RDI[3].
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = *(element_type **)(in_RSI + 0x30);
  in_RDI[3].
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x38);
  in_RDI[4].
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = *(element_type **)(in_RSI + 0x40);
  return;
}

Assistant:

location(const location&) = default;